

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFieldByName(DescriptorPool *this,string *name)

{
  bool bVar1;
  Symbol SVar2;
  Symbol result;
  string *in_stack_00000050;
  DescriptorPool *in_stack_00000058;
  Tables *in_stack_00000060;
  anon_union_8_8_13f84498_for_Symbol_2 local_8;
  
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4ae5c1);
  SVar2 = Tables::FindByNameHelper(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  local_8 = SVar2.field_1;
  if ((SVar2.type != FIELD) ||
     (bVar1 = FieldDescriptor::is_extension(local_8.field_descriptor), bVar1)) {
    local_8.descriptor = (Descriptor *)0x0;
  }
  return (FieldDescriptor *)local_8.descriptor;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindFieldByName(
    const std::string& name) const {
  Symbol result = tables_->FindByNameHelper(this, name);
  if (result.type == Symbol::FIELD &&
      !result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return nullptr;
  }
}